

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O3

void __thiscall Assimp::ColladaParser::SkipElement(ColladaParser *this,char *pElement)

{
  int iVar1;
  string element;
  allocator<char> local_31;
  long *local_30 [2];
  long local_20 [2];
  
  std::__cxx11::string::string<std::allocator<char>>((string *)local_30,pElement,&local_31);
  do {
    do {
      iVar1 = (*this->mReader->_vptr_IIrrXMLReader[2])();
      if ((char)iVar1 == '\0') goto LAB_004035a2;
      iVar1 = (*this->mReader->_vptr_IIrrXMLReader[3])();
    } while (iVar1 != 2);
    (*this->mReader->_vptr_IIrrXMLReader[0xd])();
    iVar1 = std::__cxx11::string::compare((char *)local_30);
  } while (iVar1 != 0);
LAB_004035a2:
  if (local_30[0] != local_20) {
    operator_delete(local_30[0],local_20[0] + 1);
  }
  return;
}

Assistant:

void ColladaParser::SkipElement(const char* pElement)
{
    // copy the current node's name because it'a pointer to the reader's internal buffer,
    // which is going to change with the upcoming parsing
    std::string element = pElement;
    while (mReader->read())
    {
        if (mReader->getNodeType() == irr::io::EXN_ELEMENT_END)
            if (mReader->getNodeName() == element)
                break;
    }
}